

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_multi_batch_size_helper(void)

{
  int iVar1;
  size_t n;
  size_t max_n_batch_points;
  size_t n_batch_points;
  size_t n_batches;
  size_t local_10;
  size_t local_8;
  
  iVar1 = secp256k1_ecmult_multi_batch_size_helper(&local_8,&local_10,0,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13ee,
            "test condition failed: secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_ecmult_multi_batch_size_helper(&local_8,&local_10,1,0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13f2,
            "test condition failed: secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1"
           );
    abort();
  }
  if (local_8 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13f3,"test condition failed: n_batches == 0");
    abort();
  }
  if (local_10 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13f4,"test condition failed: n_batch_points == 0");
    abort();
  }
  iVar1 = secp256k1_ecmult_multi_batch_size_helper(&local_8,&local_10,2,5);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13f8,
            "test condition failed: secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1"
           );
    abort();
  }
  if (local_8 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13f9,"test condition failed: n_batches == 3");
    abort();
  }
  if (local_10 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13fa,"test condition failed: n_batch_points == 2");
    abort();
  }
  iVar1 = secp256k1_ecmult_multi_batch_size_helper(&local_8,&local_10,5000000,5000000);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13fe,
            "test condition failed: secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1"
           );
    abort();
  }
  if (local_8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13ff,"test condition failed: n_batches == 1");
    abort();
  }
  if (local_10 != 5000000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1400,"test condition failed: n_batch_points == ECMULT_MAX_POINTS_PER_BATCH");
    abort();
  }
  iVar1 = secp256k1_ecmult_multi_batch_size_helper(&local_8,&local_10,0x4c4b41,0x4c4b41);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1404,
            "test condition failed: secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1"
           );
    abort();
  }
  if (local_8 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1405,"test condition failed: n_batches == 2");
    abort();
  }
  if (local_10 != 0x2625a1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1406,"test condition failed: n_batch_points == ECMULT_MAX_POINTS_PER_BATCH/2 + 1");
    abort();
  }
  iVar1 = secp256k1_ecmult_multi_batch_size_helper(&local_8,&local_10,1,0xffffffffffffffff);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x140a,
            "test condition failed: secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1"
           );
    abort();
  }
  if (local_8 != 0xffffffffffffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x140b,"test condition failed: n_batches == SIZE_MAX");
    abort();
  }
  if (local_10 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x140c,"test condition failed: n_batch_points == 1");
    abort();
  }
  iVar1 = secp256k1_ecmult_multi_batch_size_helper(&local_8,&local_10,2,0xffffffffffffffff);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1410,
            "test condition failed: secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1"
           );
    abort();
  }
  if (local_8 != 0x8000000000000000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1411,"test condition failed: n_batches == SIZE_MAX/2 + 1");
    abort();
  }
  if (local_10 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1412,"test condition failed: n_batch_points == 2");
    abort();
  }
  return;
}

Assistant:

static void test_ecmult_multi_batch_size_helper(void) {
    size_t n_batches, n_batch_points, max_n_batch_points, n;

    max_n_batch_points = 0;
    n = 1;
    CHECK(secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 0);

    max_n_batch_points = 1;
    n = 0;
    CHECK(secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1);
    CHECK(n_batches == 0);
    CHECK(n_batch_points == 0);

    max_n_batch_points = 2;
    n = 5;
    CHECK(secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1);
    CHECK(n_batches == 3);
    CHECK(n_batch_points == 2);

    max_n_batch_points = ECMULT_MAX_POINTS_PER_BATCH;
    n = ECMULT_MAX_POINTS_PER_BATCH;
    CHECK(secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1);
    CHECK(n_batches == 1);
    CHECK(n_batch_points == ECMULT_MAX_POINTS_PER_BATCH);

    max_n_batch_points = ECMULT_MAX_POINTS_PER_BATCH + 1;
    n = ECMULT_MAX_POINTS_PER_BATCH + 1;
    CHECK(secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1);
    CHECK(n_batches == 2);
    CHECK(n_batch_points == ECMULT_MAX_POINTS_PER_BATCH/2 + 1);

    max_n_batch_points = 1;
    n = SIZE_MAX;
    CHECK(secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1);
    CHECK(n_batches == SIZE_MAX);
    CHECK(n_batch_points == 1);

    max_n_batch_points = 2;
    n = SIZE_MAX;
    CHECK(secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, max_n_batch_points, n) == 1);
    CHECK(n_batches == SIZE_MAX/2 + 1);
    CHECK(n_batch_points == 2);
}